

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::vertex_attribf(NegativeTestContext *ctx)

{
  GLuint index;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  index = NegativeTestContext::getInteger(ctx,0x8869);
  glu::CallLogWrapper::glVertexAttrib1f(&ctx->super_CallLogWrapper,index,0.0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib2f(&ctx->super_CallLogWrapper,index,0.0,0.0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib3f(&ctx->super_CallLogWrapper,index,0.0,0.0,0.0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttrib4f(&ctx->super_CallLogWrapper,index,0.0,0.0,0.0,0.0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void vertex_attribf (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	ctx.glVertexAttrib1f(maxVertexAttribs, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib2f(maxVertexAttribs, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib3f(maxVertexAttribs, 0.0f, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib4f(maxVertexAttribs, 0.0f, 0.0f, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}